

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

void aom_int_pro_row_sse2
               (int16_t *hbuf,uint8_t *ref,int ref_stride,int width,int height,int norm_factor)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i zero;
  int local_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined8 *local_1d8;
  int local_1cc;
  byte local_178;
  byte bStack_177;
  byte bStack_176;
  byte bStack_175;
  byte bStack_174;
  byte bStack_173;
  byte bStack_172;
  byte bStack_171;
  byte local_158;
  byte bStack_157;
  byte bStack_156;
  byte bStack_155;
  byte bStack_154;
  byte bStack_153;
  byte bStack_152;
  byte bStack_151;
  ushort uStack_146;
  ushort uStack_144;
  ushort uStack_142;
  ushort uStack_13e;
  ushort uStack_13c;
  ushort uStack_13a;
  ushort uStack_126;
  ushort uStack_124;
  ushort uStack_122;
  ushort uStack_11e;
  ushort uStack_11c;
  ushort uStack_11a;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  ushort uStack_fe;
  ushort uStack_fc;
  ushort uStack_fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  ushort uStack_e6;
  ushort uStack_e4;
  ushort uStack_e2;
  ushort uStack_de;
  ushort uStack_dc;
  ushort uStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  __m128i t1;
  __m128i t0;
  __m128i src_line;
  int idx;
  __m128i s1;
  __m128i s0;
  int16_t *hbuf_tmp;
  uint8_t *ref_tmp;
  int wd;
  
  for (local_1cc = 0; local_1cc < in_ECX; local_1cc = local_1cc + 0x10) {
    local_1d8 = (undefined8 *)(in_RSI + local_1cc);
    puVar3 = (undefined8 *)(in_RDI + (long)local_1cc * 2);
    local_1f8 = ZEXT816(0);
    local_208 = ZEXT816(0);
    local_20c = 0;
    do {
      uVar1 = *local_1d8;
      uVar2 = local_1d8[1];
      local_158 = (byte)uVar1;
      bStack_157 = (byte)((ulong)uVar1 >> 8);
      bStack_156 = (byte)((ulong)uVar1 >> 0x10);
      bStack_155 = (byte)((ulong)uVar1 >> 0x18);
      bStack_154 = (byte)((ulong)uVar1 >> 0x20);
      bStack_153 = (byte)((ulong)uVar1 >> 0x28);
      bStack_152 = (byte)((ulong)uVar1 >> 0x30);
      bStack_151 = (byte)((ulong)uVar1 >> 0x38);
      s1[0]._0_1_ = (byte)uVar2;
      s1[0]._1_1_ = (byte)((ulong)uVar2 >> 8);
      s1[0]._2_1_ = (byte)((ulong)uVar2 >> 0x10);
      s1[0]._3_1_ = (byte)((ulong)uVar2 >> 0x18);
      s1[0]._4_1_ = (byte)((ulong)uVar2 >> 0x20);
      s1[0]._5_1_ = (byte)((ulong)uVar2 >> 0x28);
      s1[0]._6_1_ = (byte)((ulong)uVar2 >> 0x30);
      s1[0]._7_1_ = (byte)((ulong)uVar2 >> 0x38);
      local_d8 = local_1f8._0_2_;
      sStack_d6 = local_1f8._2_2_;
      sStack_d4 = local_1f8._4_2_;
      sStack_d2 = local_1f8._6_2_;
      sStack_d0 = local_1f8._8_2_;
      sStack_ce = local_1f8._10_2_;
      sStack_cc = local_1f8._12_2_;
      sStack_ca = local_1f8._14_2_;
      uStack_e6 = (ushort)bStack_157;
      uStack_e4 = (ushort)bStack_156;
      uStack_e2 = (ushort)bStack_155;
      uStack_de = (ushort)bStack_153;
      uStack_dc = (ushort)bStack_152;
      uStack_da = (ushort)bStack_151;
      local_f8 = local_208._0_2_;
      sStack_f6 = local_208._2_2_;
      sStack_f4 = local_208._4_2_;
      sStack_f2 = local_208._6_2_;
      sStack_f0 = local_208._8_2_;
      sStack_ee = local_208._10_2_;
      sStack_ec = local_208._12_2_;
      sStack_ea = local_208._14_2_;
      uStack_106 = (ushort)s1[0]._1_1_;
      uStack_104 = (ushort)s1[0]._2_1_;
      uStack_102 = (ushort)s1[0]._3_1_;
      uStack_fe = (ushort)s1[0]._5_1_;
      uStack_fc = (ushort)s1[0]._6_1_;
      uStack_fa = (ushort)s1[0]._7_1_;
      local_1d8 = (undefined8 *)((long)local_1d8 + (long)in_EDX);
      uVar1 = *local_1d8;
      uVar2 = local_1d8[1];
      local_178 = (byte)uVar1;
      bStack_177 = (byte)((ulong)uVar1 >> 8);
      bStack_176 = (byte)((ulong)uVar1 >> 0x10);
      bStack_175 = (byte)((ulong)uVar1 >> 0x18);
      bStack_174 = (byte)((ulong)uVar1 >> 0x20);
      bStack_173 = (byte)((ulong)uVar1 >> 0x28);
      bStack_172 = (byte)((ulong)uVar1 >> 0x30);
      bStack_171 = (byte)((ulong)uVar1 >> 0x38);
      src_line[0]._0_1_ = (byte)uVar2;
      src_line[0]._1_1_ = (byte)((ulong)uVar2 >> 8);
      src_line[0]._2_1_ = (byte)((ulong)uVar2 >> 0x10);
      src_line[0]._3_1_ = (byte)((ulong)uVar2 >> 0x18);
      src_line[0]._4_1_ = (byte)((ulong)uVar2 >> 0x20);
      src_line[0]._5_1_ = (byte)((ulong)uVar2 >> 0x28);
      src_line[0]._6_1_ = (byte)((ulong)uVar2 >> 0x30);
      src_line[0]._7_1_ = (byte)((ulong)uVar2 >> 0x38);
      uStack_126 = (ushort)bStack_177;
      uStack_124 = (ushort)bStack_176;
      uStack_122 = (ushort)bStack_175;
      uStack_11e = (ushort)bStack_173;
      uStack_11c = (ushort)bStack_172;
      uStack_11a = (ushort)bStack_171;
      local_1f8._2_2_ = sStack_d6 + uStack_e6 + uStack_126;
      local_1f8._0_2_ = local_d8 + (ushort)local_158 + (ushort)local_178;
      local_1f8._4_2_ = sStack_d4 + uStack_e4 + uStack_124;
      local_1f8._6_2_ = sStack_d2 + uStack_e2 + uStack_122;
      local_1f8._8_2_ = sStack_d0 + (ushort)bStack_154 + (ushort)bStack_174;
      local_1f8._10_2_ = sStack_ce + uStack_de + uStack_11e;
      local_1f8._12_2_ = sStack_cc + uStack_dc + uStack_11c;
      local_1f8._14_2_ = sStack_ca + uStack_da + uStack_11a;
      uStack_146 = (ushort)src_line[0]._1_1_;
      uStack_144 = (ushort)src_line[0]._2_1_;
      uStack_142 = (ushort)src_line[0]._3_1_;
      uStack_13e = (ushort)src_line[0]._5_1_;
      uStack_13c = (ushort)src_line[0]._6_1_;
      uStack_13a = (ushort)src_line[0]._7_1_;
      local_208._2_2_ = sStack_f6 + uStack_106 + uStack_146;
      local_208._0_2_ = local_f8 + (ushort)(byte)s1[0] + (ushort)(byte)src_line[0];
      local_208._4_2_ = sStack_f4 + uStack_104 + uStack_144;
      local_208._6_2_ = sStack_f2 + uStack_102 + uStack_142;
      local_208._8_2_ = sStack_f0 + (ushort)s1[0]._4_1_ + (ushort)src_line[0]._4_1_;
      local_208._10_2_ = sStack_ee + uStack_fe + uStack_13e;
      local_208._12_2_ = sStack_ec + uStack_fc + uStack_13c;
      local_208._14_2_ = sStack_ea + uStack_fa + uStack_13a;
      local_1d8 = (undefined8 *)((long)local_1d8 + (long)in_EDX);
      local_20c = local_20c + 2;
    } while (local_20c < in_R8D);
    auVar4._8_8_ = local_1f8._8_8_;
    auVar4._0_8_ = local_1f8._0_8_;
    auVar4 = psraw(auVar4,ZEXT416(in_R9D));
    auVar5._8_8_ = local_208._8_8_;
    auVar5._0_8_ = local_208._0_8_;
    auVar5 = psraw(auVar5,ZEXT416(in_R9D));
    local_1f8._0_8_ = auVar4._0_8_;
    local_1f8._8_8_ = auVar4._8_8_;
    *puVar3 = local_1f8._0_8_;
    puVar3[1] = local_1f8._8_8_;
    local_208._0_8_ = auVar5._0_8_;
    local_208._8_8_ = auVar5._8_8_;
    puVar3[2] = local_208._0_8_;
    puVar3[3] = local_208._8_8_;
  }
  return;
}

Assistant:

void aom_int_pro_row_sse2(int16_t *hbuf, const uint8_t *ref,
                          const int ref_stride, const int width,
                          const int height, int norm_factor) {
  // SIMD implementation assumes width and height to be multiple of 16 and 2
  // respectively. For any odd width or height, SIMD support needs to be added.
  assert(width % 16 == 0 && height % 2 == 0);
  __m128i zero = _mm_setzero_si128();

  for (int wd = 0; wd < width; wd += 16) {
    const uint8_t *ref_tmp = ref + wd;
    int16_t *hbuf_tmp = hbuf + wd;
    __m128i s0 = zero;
    __m128i s1 = zero;
    int idx = 0;
    do {
      __m128i src_line = _mm_loadu_si128((const __m128i *)ref_tmp);
      __m128i t0 = _mm_unpacklo_epi8(src_line, zero);
      __m128i t1 = _mm_unpackhi_epi8(src_line, zero);
      s0 = _mm_add_epi16(s0, t0);
      s1 = _mm_add_epi16(s1, t1);
      ref_tmp += ref_stride;

      src_line = _mm_loadu_si128((const __m128i *)ref_tmp);
      t0 = _mm_unpacklo_epi8(src_line, zero);
      t1 = _mm_unpackhi_epi8(src_line, zero);
      s0 = _mm_add_epi16(s0, t0);
      s1 = _mm_add_epi16(s1, t1);
      ref_tmp += ref_stride;
      idx += 2;
    } while (idx < height);

    s0 = _mm_srai_epi16(s0, norm_factor);
    s1 = _mm_srai_epi16(s1, norm_factor);
    _mm_storeu_si128((__m128i *)(hbuf_tmp), s0);
    _mm_storeu_si128((__m128i *)(hbuf_tmp + 8), s1);
  }
}